

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress4X1_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  undefined1 *puVar7;
  uint uVar8;
  undefined1 *puVar9;
  int iVar10;
  ulong srcSize;
  ulong srcSize_00;
  undefined1 *puVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  undefined1 *puVar16;
  int iVar17;
  ulong srcSize_01;
  void *pvVar18;
  bool bVar19;
  BIT_DStream_t local_188;
  BIT_DStream_t local_160;
  BIT_DStream_t local_138;
  BIT_DStream_t local_110;
  HUF_DTable *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  size_t *local_d0;
  size_t local_c8;
  ulong local_c0;
  size_t *local_b8;
  size_t local_b0;
  ulong local_a8;
  size_t local_98;
  undefined1 *local_88;
  undefined1 *local_80;
  
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  srcSize_01 = (ulong)*cSrc;
  srcSize = (ulong)*(ushort *)((long)cSrc + 2);
  srcSize_00 = (ulong)*(ushort *)((long)cSrc + 4);
  uVar5 = srcSize_01 + srcSize + srcSize_00 + 6;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar5) {
    return 0xffffffffffffffec;
  }
  local_80 = (undefined1 *)((long)dst + dstSize);
  local_a8 = dstSize + 3 >> 2;
  local_e0 = (undefined1 *)((long)dst + local_a8);
  local_d8 = local_e0 + local_a8;
  local_88 = local_d8 + local_a8;
  if (local_80 < local_88) {
    return 0xffffffffffffffec;
  }
  local_c0 = (ulong)*(ushort *)((long)DTable + 2);
  local_e8 = DTable;
  local_98 = dstSize;
  sVar6 = BIT_initDStream(&local_110,(void *)((long)cSrc + 6),srcSize_01);
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  pvVar18 = (void *)((long)cSrc + srcSize_01 + 6);
  sVar6 = BIT_initDStream(&local_138,pvVar18,srcSize);
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  pvVar18 = (void *)((long)pvVar18 + srcSize);
  sVar6 = BIT_initDStream(&local_160,pvVar18,srcSize_00);
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  sVar6 = BIT_initDStream(&local_188,(void *)((long)pvVar18 + srcSize_00),cSrcSize - uVar5);
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  puVar7 = (undefined1 *)((long)dst + (local_98 - 3));
  iVar12 = (int)local_c0;
  puVar9 = local_d8;
  puVar11 = local_e0;
  puVar16 = local_88;
  if (7 < (ulong)((long)local_80 - (long)local_88)) {
    local_b0 = local_138.bitContainer;
    local_c8 = local_188.bitContainer;
    uVar13 = -iVar12 & 0x3f;
    local_b8 = (size_t *)local_110.ptr;
    local_d0 = (size_t *)local_138.ptr;
    lVar4 = local_a8 * 3;
    bVar19 = true;
    while( true ) {
      if ((puVar7 <= (undefined1 *)((long)dst + lVar4)) || (!bVar19)) break;
      uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
      local_110.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_110.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_b0 << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
      local_138.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_138.bitsConsumed;
      *(undefined1 *)((long)dst + local_a8) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
      local_160.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_160.bitsConsumed;
      *(undefined1 *)((long)dst + local_a8 * 2) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_c8 << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
      local_188.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_188.bitsConsumed;
      *(undefined1 *)((long)dst + lVar4) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
      local_110.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_110.bitsConsumed;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_b0 << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
      local_138.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_138.bitsConsumed;
      *(undefined1 *)((long)dst + local_a8 + 1) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
      local_160.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_160.bitsConsumed;
      *(undefined1 *)((long)dst + local_a8 * 2 + 1) =
           *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_c8 << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
      local_188.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_188.bitsConsumed;
      *(undefined1 *)((long)dst + lVar4 + 1) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
      local_110.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_110.bitsConsumed;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_b0 << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
      local_138.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_138.bitsConsumed;
      *(undefined1 *)((long)dst + local_a8 + 2) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
      local_160.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_160.bitsConsumed;
      *(undefined1 *)((long)dst + local_a8 * 2 + 2) =
           *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_c8 << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
      local_188.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_188.bitsConsumed;
      *(undefined1 *)((long)dst + lVar4 + 2) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
      local_110.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_110.bitsConsumed;
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_b0 << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
      bVar1 = *(byte *)((long)local_e8 + uVar5 * 2 + 4);
      *(undefined1 *)((long)dst + local_a8 + 3) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
      bVar2 = *(byte *)((long)local_e8 + uVar5 * 2 + 4);
      *(undefined1 *)((long)dst + local_a8 * 2 + 3) =
           *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_c8 << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
      bVar3 = *(byte *)((long)local_e8 + uVar5 * 2 + 4);
      *(undefined1 *)((long)dst + lVar4 + 3) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      if (local_b8 < local_110.limitPtr) {
        iVar10 = 3;
      }
      else {
        local_b8 = (size_t *)((long)local_b8 - (ulong)(local_110.bitsConsumed >> 3));
        local_110.bitsConsumed = local_110.bitsConsumed & 7;
        local_110.bitContainer = *local_b8;
        iVar10 = 0;
      }
      local_138.bitsConsumed = local_138.bitsConsumed + bVar1;
      if (local_d0 < local_138.limitPtr) {
        iVar14 = 3;
      }
      else {
        local_d0 = (size_t *)((long)local_d0 - (ulong)(local_138.bitsConsumed >> 3));
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
        local_b0 = *local_d0;
        iVar14 = 0;
      }
      local_160.bitsConsumed = local_160.bitsConsumed + bVar2;
      if (local_160.ptr < local_160.limitPtr) {
        iVar15 = 3;
      }
      else {
        local_160.ptr = (char *)((long)local_160.ptr - (ulong)(local_160.bitsConsumed >> 3));
        local_160.bitsConsumed = local_160.bitsConsumed & 7;
        local_160.bitContainer = *(size_t *)local_160.ptr;
        iVar15 = 0;
      }
      local_188.bitsConsumed = local_188.bitsConsumed + bVar3;
      if (local_188.ptr < local_188.limitPtr) {
        iVar17 = 3;
      }
      else {
        local_188.ptr = (char *)((long)local_188.ptr - (ulong)(local_188.bitsConsumed >> 3));
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
        local_c8 = *(size_t *)local_188.ptr;
        iVar17 = 0;
      }
      dst = (void *)((long)dst + 4);
      bVar19 = ((iVar14 == 0 && iVar10 == 0) && iVar15 == 0) && iVar17 == 0;
    }
    local_110.ptr = (char *)local_b8;
    local_138.ptr = (char *)local_d0;
    local_138.bitContainer = local_b0;
    local_188.bitContainer = local_c8;
    puVar9 = (undefined1 *)((long)dst + local_a8 * 2);
    puVar11 = (undefined1 *)((long)dst + local_a8);
    puVar16 = (undefined1 *)((long)dst + lVar4);
  }
  if (local_88 < puVar9 || (local_d8 < puVar11 || local_e0 < dst)) {
    return 0xffffffffffffffec;
  }
  if ((long)local_e0 - (long)dst < 4) {
    if (local_110.bitsConsumed < 0x41) {
      if (local_110.ptr < local_110.limitPtr) {
        if (local_110.ptr == local_110.start) goto LAB_001ab00c;
        uVar13 = (int)local_110.ptr - (int)local_110.start;
        if (local_110.start <=
            (size_t *)((long)local_110.ptr - (ulong)(local_110.bitsConsumed >> 3))) {
          uVar13 = local_110.bitsConsumed >> 3;
        }
        local_110.bitsConsumed = local_110.bitsConsumed + uVar13 * -8;
      }
      else {
        uVar13 = local_110.bitsConsumed >> 3;
        local_110.bitsConsumed = local_110.bitsConsumed & 7;
      }
      local_110.ptr = (char *)((long)local_110.ptr - (ulong)uVar13);
      local_110.bitContainer = *(size_t *)local_110.ptr;
    }
  }
  else {
    uVar13 = -iVar12 & 0x3f;
    for (; local_110.bitsConsumed < 0x41; local_110.bitsConsumed = bVar1 + local_110.bitsConsumed) {
      if (local_110.ptr < local_110.limitPtr) {
        if (local_110.ptr == local_110.start) break;
        bVar19 = local_110.start <=
                 (size_t *)((long)local_110.ptr - (ulong)(local_110.bitsConsumed >> 3));
        uVar8 = (int)local_110.ptr - (int)local_110.start;
        if (bVar19) {
          uVar8 = local_110.bitsConsumed >> 3;
        }
        local_110.bitsConsumed = local_110.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_110.bitsConsumed >> 3;
        local_110.bitsConsumed = local_110.bitsConsumed & 7;
        bVar19 = true;
      }
      local_110.ptr = (char *)((long)local_110.ptr - (ulong)uVar8);
      local_110.bitContainer = *(size_t *)local_110.ptr;
      if ((local_e0 + -3 <= dst) || (!bVar19)) break;
      uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
      local_110.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_110.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
      local_110.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_110.bitsConsumed;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
      local_110.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_110.bitsConsumed;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
      bVar1 = *(byte *)((long)local_e8 + uVar5 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      dst = (void *)((long)dst + 4);
    }
  }
LAB_001ab00c:
  uVar13 = -iVar12 & 0x3f;
  for (; dst < local_e0; dst = (void *)((long)dst + 1)) {
    uVar5 = (local_110.bitContainer << ((ulong)local_110.bitsConsumed & 0x3f)) >> uVar13;
    local_110.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_110.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
  }
  if ((long)local_d8 - (long)puVar11 < 4) {
    if (local_138.bitsConsumed < 0x41) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) goto LAB_001ab20f;
        uVar8 = (int)local_138.ptr - (int)local_138.start;
        if (local_138.start <=
            (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3))) {
          uVar8 = local_138.bitsConsumed >> 3;
        }
        local_138.bitsConsumed = local_138.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_138.bitsConsumed >> 3;
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
      }
      local_138.ptr = (char *)((long)local_138.ptr - (ulong)uVar8);
      local_138.bitContainer = *(size_t *)local_138.ptr;
    }
  }
  else {
    for (; local_138.bitsConsumed < 0x41; local_138.bitsConsumed = bVar1 + local_138.bitsConsumed) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) break;
        bVar19 = local_138.start <=
                 (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3));
        uVar8 = (int)local_138.ptr - (int)local_138.start;
        if (bVar19) {
          uVar8 = local_138.bitsConsumed >> 3;
        }
        local_138.bitsConsumed = local_138.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_138.bitsConsumed >> 3;
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
        bVar19 = true;
      }
      local_138.ptr = (char *)((long)local_138.ptr - (ulong)uVar8);
      local_138.bitContainer = *(size_t *)local_138.ptr;
      if ((local_d8 + -3 <= puVar11) || (!bVar19)) break;
      uVar5 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
      local_138.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_138.bitsConsumed;
      *puVar11 = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
      local_138.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_138.bitsConsumed;
      puVar11[1] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
      local_138.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_138.bitsConsumed;
      puVar11[2] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
      bVar1 = *(byte *)((long)local_e8 + uVar5 * 2 + 4);
      puVar11[3] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      puVar11 = puVar11 + 4;
    }
  }
LAB_001ab20f:
  for (; puVar11 < local_d8; puVar11 = puVar11 + 1) {
    uVar5 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar13;
    local_138.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_138.bitsConsumed;
    *puVar11 = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
  }
  if ((long)local_88 - (long)puVar9 < 4) {
    if (local_160.bitsConsumed < 0x41) {
      if (local_160.ptr < local_160.limitPtr) {
        if (local_160.ptr == local_160.start) goto LAB_001ab3d4;
        uVar8 = (int)local_160.ptr - (int)local_160.start;
        if (local_160.start <=
            (size_t *)((long)local_160.ptr - (ulong)(local_160.bitsConsumed >> 3))) {
          uVar8 = local_160.bitsConsumed >> 3;
        }
        local_160.bitsConsumed = local_160.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_160.bitsConsumed >> 3;
        local_160.bitsConsumed = local_160.bitsConsumed & 7;
      }
      local_160.ptr = (char *)((long)local_160.ptr - (ulong)uVar8);
      local_160.bitContainer = *(size_t *)local_160.ptr;
    }
  }
  else {
    for (; local_160.bitsConsumed < 0x41; local_160.bitsConsumed = bVar1 + local_160.bitsConsumed) {
      if (local_160.ptr < local_160.limitPtr) {
        if (local_160.ptr == local_160.start) break;
        bVar19 = local_160.start <=
                 (size_t *)((long)local_160.ptr - (ulong)(local_160.bitsConsumed >> 3));
        uVar8 = (int)local_160.ptr - (int)local_160.start;
        if (bVar19) {
          uVar8 = local_160.bitsConsumed >> 3;
        }
        local_160.bitsConsumed = local_160.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_160.bitsConsumed >> 3;
        local_160.bitsConsumed = local_160.bitsConsumed & 7;
        bVar19 = true;
      }
      local_160.ptr = (char *)((long)local_160.ptr - (ulong)uVar8);
      local_160.bitContainer = *(size_t *)local_160.ptr;
      if ((local_88 + -3 <= puVar9) || (!bVar19)) break;
      uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
      local_160.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_160.bitsConsumed;
      *puVar9 = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
      local_160.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_160.bitsConsumed;
      puVar9[1] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
      local_160.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_160.bitsConsumed;
      puVar9[2] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
      bVar1 = *(byte *)((long)local_e8 + uVar5 * 2 + 4);
      puVar9[3] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      puVar9 = puVar9 + 4;
    }
  }
LAB_001ab3d4:
  for (; puVar9 < local_88; puVar9 = puVar9 + 1) {
    uVar5 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar13;
    local_160.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_160.bitsConsumed;
    *puVar9 = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
  }
  if ((long)local_80 - (long)puVar16 < 4) {
    if (local_188.bitsConsumed < 0x41) {
      if (local_188.ptr < local_188.limitPtr) {
        if (local_188.ptr == local_188.start) goto LAB_001ab590;
        uVar8 = (int)local_188.ptr - (int)local_188.start;
        if (local_188.start <=
            (size_t *)((long)local_188.ptr - (ulong)(local_188.bitsConsumed >> 3))) {
          uVar8 = local_188.bitsConsumed >> 3;
        }
        local_188.bitsConsumed = local_188.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_188.bitsConsumed >> 3;
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
      }
      local_188.ptr = (char *)((long)local_188.ptr - (ulong)uVar8);
      local_188.bitContainer = *(size_t *)local_188.ptr;
    }
  }
  else {
    for (; local_188.bitsConsumed < 0x41; local_188.bitsConsumed = bVar1 + local_188.bitsConsumed) {
      if (local_188.ptr < local_188.limitPtr) {
        if (local_188.ptr == local_188.start) break;
        bVar19 = local_188.start <=
                 (size_t *)((long)local_188.ptr - (ulong)(local_188.bitsConsumed >> 3));
        uVar8 = (int)local_188.ptr - (int)local_188.start;
        if (bVar19) {
          uVar8 = local_188.bitsConsumed >> 3;
        }
        local_188.bitsConsumed = local_188.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_188.bitsConsumed >> 3;
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
        bVar19 = true;
      }
      local_188.ptr = (char *)((long)local_188.ptr - (ulong)uVar8);
      local_188.bitContainer = *(size_t *)local_188.ptr;
      if ((puVar7 <= puVar16) || (!bVar19)) break;
      uVar5 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
      local_188.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_188.bitsConsumed;
      *puVar16 = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
      local_188.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_188.bitsConsumed;
      puVar16[1] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
      local_188.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_188.bitsConsumed;
      puVar16[2] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      uVar5 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
      bVar1 = *(byte *)((long)local_e8 + uVar5 * 2 + 4);
      puVar16[3] = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
      puVar16 = puVar16 + 4;
    }
  }
LAB_001ab590:
  for (; puVar16 < local_80; puVar16 = puVar16 + 1) {
    uVar5 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar13;
    local_188.bitsConsumed = *(byte *)((long)local_e8 + uVar5 * 2 + 4) + local_188.bitsConsumed;
    *puVar16 = *(undefined1 *)((long)local_e8 + uVar5 * 2 + 5);
  }
  sVar6 = 0xffffffffffffffec;
  if (local_188.bitsConsumed != 0x40) {
    local_98 = sVar6;
  }
  if (local_188.ptr != local_188.start) {
    local_98 = sVar6;
  }
  if (local_160.bitsConsumed != 0x40) {
    local_98 = sVar6;
  }
  if (local_160.ptr != local_160.start) {
    local_98 = sVar6;
  }
  if (local_138.bitsConsumed != 0x40) {
    local_98 = sVar6;
  }
  if (local_138.ptr != local_138.start) {
    local_98 = sVar6;
  }
  if (local_110.bitsConsumed != 0x40) {
    local_98 = sVar6;
  }
  if (local_110.ptr != local_110.start) {
    local_98 = sVar6;
  }
  return local_98;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_decompress4X1_usingDTable_internal_body(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    /* Check */
    if (cSrcSize < 10) return ERROR(corruption_detected);  /* strict minimum : jump table + 1 byte per stream */

    {   const BYTE* const istart = (const BYTE*) cSrc;
        BYTE* const ostart = (BYTE*) dst;
        BYTE* const oend = ostart + dstSize;
        BYTE* const olimit = oend - 3;
        const void* const dtPtr = DTable + 1;
        const HUF_DEltX1* const dt = (const HUF_DEltX1*)dtPtr;

        /* Init */
        BIT_DStream_t bitD1;
        BIT_DStream_t bitD2;
        BIT_DStream_t bitD3;
        BIT_DStream_t bitD4;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = cSrcSize - (length1 + length2 + length3 + 6);
        const BYTE* const istart1 = istart + 6;  /* jumpTable */
        const BYTE* const istart2 = istart1 + length1;
        const BYTE* const istart3 = istart2 + length2;
        const BYTE* const istart4 = istart3 + length3;
        const size_t segmentSize = (dstSize+3) / 4;
        BYTE* const opStart2 = ostart + segmentSize;
        BYTE* const opStart3 = opStart2 + segmentSize;
        BYTE* const opStart4 = opStart3 + segmentSize;
        BYTE* op1 = ostart;
        BYTE* op2 = opStart2;
        BYTE* op3 = opStart3;
        BYTE* op4 = opStart4;
        DTableDesc const dtd = HUF_getDTableDesc(DTable);
        U32 const dtLog = dtd.tableLog;
        U32 endSignal = 1;

        if (length4 > cSrcSize) return ERROR(corruption_detected);   /* overflow */
        if (opStart4 > oend) return ERROR(corruption_detected);      /* overflow */
        if (dstSize < 6) return ERROR(corruption_detected);         /* stream 4-split doesn't work */
        CHECK_F( BIT_initDStream(&bitD1, istart1, length1) );
        CHECK_F( BIT_initDStream(&bitD2, istart2, length2) );
        CHECK_F( BIT_initDStream(&bitD3, istart3, length3) );
        CHECK_F( BIT_initDStream(&bitD4, istart4, length4) );

        /* up to 16 symbols per loop (4 symbols per stream) in 64-bit mode */
        if ((size_t)(oend - op4) >= sizeof(size_t)) {
            for ( ; (endSignal) & (op4 < olimit) ; ) {
                HUF_DECODE_SYMBOLX1_2(op1, &bitD1);
                HUF_DECODE_SYMBOLX1_2(op2, &bitD2);
                HUF_DECODE_SYMBOLX1_2(op3, &bitD3);
                HUF_DECODE_SYMBOLX1_2(op4, &bitD4);
                HUF_DECODE_SYMBOLX1_1(op1, &bitD1);
                HUF_DECODE_SYMBOLX1_1(op2, &bitD2);
                HUF_DECODE_SYMBOLX1_1(op3, &bitD3);
                HUF_DECODE_SYMBOLX1_1(op4, &bitD4);
                HUF_DECODE_SYMBOLX1_2(op1, &bitD1);
                HUF_DECODE_SYMBOLX1_2(op2, &bitD2);
                HUF_DECODE_SYMBOLX1_2(op3, &bitD3);
                HUF_DECODE_SYMBOLX1_2(op4, &bitD4);
                HUF_DECODE_SYMBOLX1_0(op1, &bitD1);
                HUF_DECODE_SYMBOLX1_0(op2, &bitD2);
                HUF_DECODE_SYMBOLX1_0(op3, &bitD3);
                HUF_DECODE_SYMBOLX1_0(op4, &bitD4);
                endSignal &= BIT_reloadDStreamFast(&bitD1) == BIT_DStream_unfinished;
                endSignal &= BIT_reloadDStreamFast(&bitD2) == BIT_DStream_unfinished;
                endSignal &= BIT_reloadDStreamFast(&bitD3) == BIT_DStream_unfinished;
                endSignal &= BIT_reloadDStreamFast(&bitD4) == BIT_DStream_unfinished;
            }
        }

        /* check corruption */
        /* note : should not be necessary : op# advance in lock step, and we control op4.
         *        but curiously, binary generated by gcc 7.2 & 7.3 with -mbmi2 runs faster when >=1 test is present */
        if (op1 > opStart2) return ERROR(corruption_detected);
        if (op2 > opStart3) return ERROR(corruption_detected);
        if (op3 > opStart4) return ERROR(corruption_detected);
        /* note : op4 supposed already verified within main loop */

        /* finish bitStreams one by one */
        HUF_decodeStreamX1(op1, &bitD1, opStart2, dt, dtLog);
        HUF_decodeStreamX1(op2, &bitD2, opStart3, dt, dtLog);
        HUF_decodeStreamX1(op3, &bitD3, opStart4, dt, dtLog);
        HUF_decodeStreamX1(op4, &bitD4, oend,     dt, dtLog);

        /* check */
        { U32 const endCheck = BIT_endOfDStream(&bitD1) & BIT_endOfDStream(&bitD2) & BIT_endOfDStream(&bitD3) & BIT_endOfDStream(&bitD4);
          if (!endCheck) return ERROR(corruption_detected); }

        /* decoded size */
        return dstSize;
    }
}